

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::SubroutinesBase::TessEvalShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                                                  \nlayout(triangles, equal_spacing) in;                          \nsubroutine vec4 a_t();               \nsubroutine uniform a_t a;            \nsubroutine(a_t) vec4 x() {           \n   return vec4(1);                   \n}                                    \nvoid main() {                                \n   vec4 p0 = gl_in[0].gl_Position;           \n   vec4 p1 = gl_in[1].gl_Position;           \n   vec4 p2 = gl_in[2].gl_Position;           \n   vec3 p = gl_TessCoord.xyz;                \n   gl_Position = a();                        \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TessEvalShader()
	{
		return "#version 430                                                  \n"
			   "layout(triangles, equal_spacing) in;                          \n"
			   ""
			   "subroutine vec4 a_t();               \n"
			   "subroutine uniform a_t a;            \n"
			   "subroutine(a_t) vec4 x() {           \n"
			   "   return vec4(1);                   \n"
			   "}                                    \n"
			   ""
			   "void main() {                                \n"
			   "   vec4 p0 = gl_in[0].gl_Position;           \n"
			   "   vec4 p1 = gl_in[1].gl_Position;           \n"
			   "   vec4 p2 = gl_in[2].gl_Position;           \n"
			   "   vec3 p = gl_TessCoord.xyz;                \n"
			   "   gl_Position = a();                        \n"
			   "}";
	}